

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<short>::test_vectordivide_numerators<(libdivide::Branching)1>
          (DivideTest<short> *this,short denom,divider<short,_(libdivide::Branching)1> *the_divider)

{
  UT UVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  UT UVar6;
  uint uVar7;
  size_t i;
  long lVar8;
  char mem [128];
  UT local_80 [40];
  
  lVar8 = 0;
  do {
    uVar2 = this->seed;
    uVar4 = (uint)this->rand_n;
    lVar5 = 0;
    do {
      uVar2 = uVar2 * 0x19660d + 0x3c6ef35f;
      uVar7 = uVar4 * ((uVar2 & 1) + 2) + 3;
      uVar3 = (ushort)uVar4;
      uVar4 = uVar2 % 0x13;
      if (uVar3 <= (ushort)uVar7) {
        uVar4 = uVar7;
      }
      UVar1 = (UT)uVar4;
      UVar6 = -UVar1;
      if ((uVar2 & 1) == 0) {
        UVar6 = UVar1;
      }
      local_80[lVar5] = UVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    this->seed = uVar2;
    this->rand_n = UVar1;
    test_vec<long_long__vector(2),(libdivide::Branching)1>
              (this,(short *)local_80,0x20,denom,the_divider);
    test_vec<long_long__vector(4),(libdivide::Branching)1>
              (this,(short *)local_80,0x20,denom,the_divider);
    test_vec<long_long__vector(8),(libdivide::Branching)1>
              (this,(short *)local_80,0x20,denom,the_divider);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10000);
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }